

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O0

bool goodform::msgpack::serialize(any *v,ostream *output)

{
  bool bVar1;
  byte bVar2;
  __uint16_t __bsx;
  __uint32_t __bsx_00;
  reference v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  float *pfVar6;
  double *pdVar7;
  uchar *puVar8;
  unsigned_short *puVar9;
  unsigned_long *puVar10;
  char *pcVar11;
  __uint16_t *p_Var12;
  __uint32_t *p_Var13;
  __uint64_t *p_Var14;
  long lVar15;
  vector<std::any,_std::allocator<std::any>_> *pvVar16;
  size_type sVar17;
  const_reference pvVar18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar19;
  size_type sVar20;
  long *plVar21;
  ulong uVar22;
  pointer ppVar23;
  char cVar24;
  bool local_23a;
  bool local_229;
  bool local_219;
  bool local_209;
  undefined1 local_158 [8];
  any key_2;
  _Self local_140;
  const_iterator it_3;
  object_t *o_1;
  undefined1 local_128 [4];
  uint32_t sz_be_7;
  any key_1;
  _Self local_110;
  const_iterator it_2;
  object_t *o;
  ulong uStack_f8;
  uint16_t sz_be_6;
  size_t i_1;
  ulong uStack_e8;
  uint32_t sz_be_5;
  size_t i;
  __uint32_t local_d8;
  uint16_t sz_be_4;
  uint32_t sz_be_3;
  uint16_t sz_be_2;
  int64_t be_7;
  int32_t be_6;
  int32_t val_5;
  int16_t be_5;
  int16_t val_4;
  __uint64_t _Stack_b8;
  int8_t val_3;
  uint64_t be_4;
  uint32_t be_3;
  uint32_t val_2;
  uint16_t be_2;
  uint16_t val_1;
  __uint64_t _Stack_a0;
  uint8_t val;
  uint64_t be_1;
  numeric_union64 nu_1;
  double dbl;
  float local_80;
  uint32_t be;
  numeric_union32 nu;
  float flt;
  uint32_t sz_be_1;
  uint16_t sz_be;
  __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_> local_68;
  const_iterator it_1;
  array_t *tmp_1;
  undefined1 local_48 [8];
  any key;
  _Self local_30;
  const_iterator it;
  object_t *tmp;
  bool ret;
  ostream *output_local;
  any *v_local;
  
  tmp._7_1_ = true;
  bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                    (v);
  cVar24 = (char)output;
  if (bVar1) {
    pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                        (v);
    sVar20 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::size(pmVar19);
    if (sVar20 < 0x10) {
      pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                          (v);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
      ::size(pmVar19);
      std::ostream::put(cVar24);
      bVar2 = std::ios::good();
      tmp._7_1_ = (bool)(bVar2 & 1);
      if (tmp._7_1_ == false) {
        return false;
      }
      it._M_node = (_Base_ptr)
                   get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                             (v);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                    *)it._M_node);
      while( true ) {
        key._M_storage =
             (_Storage)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                    *)it._M_node);
        bVar1 = std::operator!=(&local_30,(_Self *)&key._M_storage);
        if (!bVar1) break;
        ppVar23 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                  ::operator->(&local_30);
        std::any::
        any<std::__cxx11::string_const&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  ((any *)local_48,&ppVar23->first);
        tmp._7_1_ = serialize((any *)local_48,output);
        if (tmp._7_1_) {
          ppVar23 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                    ::operator->(&local_30);
          tmp._7_1_ = serialize(&ppVar23->second,output);
        }
        std::any::~any((any *)local_48);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
        ::operator++(&local_30);
      }
      return tmp._7_1_;
    }
  }
  bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
  if (bVar1) {
    pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
    sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size(pvVar16);
    if (sVar17 < 0x10) {
      pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
      std::vector<std::any,_std::allocator<std::any>_>::size(pvVar16);
      std::ostream::put(cVar24);
      bVar2 = std::ios::good();
      tmp._7_1_ = (bool)(bVar2 & 1);
      if (tmp._7_1_ == false) {
        return false;
      }
      it_1._M_current = (any *)get<std::vector<std::any,std::allocator<std::any>>>(v);
      local_68._M_current =
           (any *)std::vector<std::any,_std::allocator<std::any>_>::begin
                            ((vector<std::any,_std::allocator<std::any>_> *)it_1._M_current);
      while( true ) {
        _sz_be_1 = std::vector<std::any,_std::allocator<std::any>_>::end(it_1._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_68,
                           (__normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_>
                            *)&sz_be_1);
        if (!bVar1) break;
        v_00 = __gnu_cxx::
               __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_>
               ::operator*(&local_68);
        tmp._7_1_ = serialize(v_00,output);
        __gnu_cxx::
        __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_>::
        operator++(&local_68);
      }
      return tmp._7_1_;
    }
  }
  bVar1 = is<std::__cxx11::string>(v);
  if (bVar1) {
    get<std::__cxx11::string>(v);
    uVar22 = std::__cxx11::string::size();
    if (uVar22 < 0x20) {
      get<std::__cxx11::string>(v);
      std::__cxx11::string::size();
      std::ostream::put(cVar24);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        return false;
      }
      pbVar3 = get<std::__cxx11::string>(v);
      lVar15 = std::__cxx11::string::operator[]((ulong)pbVar3);
      get<std::__cxx11::string>(v);
      std::__cxx11::string::size();
      std::ostream::write((char *)output,lVar15);
      bVar2 = std::ios::good();
      return (bool)(bVar2 & 1);
    }
  }
  bVar1 = is<decltype(nullptr)>(v);
  if (bVar1) {
    std::ostream::put(cVar24);
  }
  else {
    bVar1 = is<bool>(v);
    if (bVar1) {
      pbVar4 = get<bool>(v);
      if ((*pbVar4 & 1U) == 0) {
        std::ostream::put(cVar24);
      }
      else {
        std::ostream::put(cVar24);
      }
    }
    else {
      bVar1 = is<std::vector<char,std::allocator<char>>>(v);
      if (bVar1) {
        pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
        sVar17 = std::vector<char,_std::allocator<char>_>::size(pvVar5);
        if (sVar17 < 0x100) {
          plVar21 = (long *)std::ostream::put(cVar24);
          uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
          if ((uVar22 & 1) == 0) {
            pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
            std::vector<char,_std::allocator<char>_>::size(pvVar5);
            plVar21 = (long *)std::ostream::put(cVar24);
            uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
            if ((uVar22 & 1) == 0) {
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              pcVar11 = std::vector<char,_std::allocator<char>_>::data(pvVar5);
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              std::vector<char,_std::allocator<char>_>::size(pvVar5);
              plVar21 = (long *)std::ostream::write((char *)output,(long)pcVar11);
              uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
              if ((uVar22 & 1) == 0) {
                return true;
              }
            }
          }
          return false;
        }
      }
      bVar1 = is<std::vector<char,std::allocator<char>>>(v);
      if (bVar1) {
        pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
        sVar17 = std::vector<char,_std::allocator<char>_>::size(pvVar5);
        if (sVar17 < 0x10000) {
          pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
          sVar17 = std::vector<char,_std::allocator<char>_>::size(pvVar5);
          flt._2_2_ = __bswap_16((__uint16_t)sVar17);
          plVar21 = (long *)std::ostream::put(cVar24);
          uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
          if ((uVar22 & 1) == 0) {
            plVar21 = (long *)std::ostream::write((char *)output,(long)&flt + 2);
            uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
            if ((uVar22 & 1) == 0) {
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              pcVar11 = std::vector<char,_std::allocator<char>_>::data(pvVar5);
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              std::vector<char,_std::allocator<char>_>::size(pvVar5);
              plVar21 = (long *)std::ostream::write((char *)output,(long)pcVar11);
              uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
              if ((uVar22 & 1) == 0) {
                return true;
              }
            }
          }
          return false;
        }
      }
      bVar1 = is<std::vector<char,std::allocator<char>>>(v);
      if (bVar1) {
        pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
        sVar17 = std::vector<char,_std::allocator<char>_>::size(pvVar5);
        if (sVar17 < 0x100000000) {
          pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
          sVar17 = std::vector<char,_std::allocator<char>_>::size(pvVar5);
          nu.i = __bswap_32((__uint32_t)sVar17);
          plVar21 = (long *)std::ostream::put(cVar24);
          uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
          if ((uVar22 & 1) == 0) {
            plVar21 = (long *)std::ostream::write((char *)output,(long)&nu);
            uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
            if ((uVar22 & 1) == 0) {
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              pcVar11 = std::vector<char,_std::allocator<char>_>::data(pvVar5);
              pvVar5 = get<std::vector<char,std::allocator<char>>>(v);
              std::vector<char,_std::allocator<char>_>::size(pvVar5);
              plVar21 = (long *)std::ostream::write((char *)output,(long)pcVar11);
              uVar22 = std::ios::operator!((ios *)((long)plVar21 + *(long *)(*plVar21 + -0x18)));
              if ((uVar22 & 1) == 0) {
                return true;
              }
            }
          }
          return false;
        }
      }
      bVar1 = is<float>(v);
      if (bVar1) {
        pfVar6 = get<float>(v);
        local_80 = *pfVar6;
        be = (uint32_t)local_80;
        dbl._4_4_ = __bswap_32((__uint32_t)local_80);
        std::ostream::put(cVar24);
        bVar2 = std::ios::good();
        tmp._7_1_ = (bool)(bVar2 & 1);
        if (tmp._7_1_ != false) {
          std::ostream::write((char *)output,(long)&dbl + 4);
          bVar2 = std::ios::good();
          tmp._7_1_ = (bool)(bVar2 & 1);
        }
      }
      else {
        bVar1 = is<double>(v);
        if (bVar1) {
          pdVar7 = get<double>(v);
          be_1 = (uint64_t)*pdVar7;
          nu_1 = (numeric_union64)(numeric_union64)be_1;
          _Stack_a0 = __bswap_64(be_1);
          std::ostream::put(cVar24);
          bVar2 = std::ios::good();
          tmp._7_1_ = (bool)(bVar2 & 1);
          if (tmp._7_1_ != false) {
            std::ostream::write((char *)output,(long)&stack0xffffffffffffff60);
            bVar2 = std::ios::good();
            tmp._7_1_ = (bool)(bVar2 & 1);
          }
        }
        else {
          bVar1 = is<unsigned_char>(v);
          if (bVar1) {
            puVar8 = get<unsigned_char>(v);
            val_2._3_1_ = *puVar8;
            std::ostream::put(cVar24);
            bVar2 = std::ios::good();
            tmp._7_1_ = (bool)(bVar2 & 1);
            if (tmp._7_1_ != false) {
              std::ostream::write((char *)output,(long)&val_2 + 3);
              bVar2 = std::ios::good();
              tmp._7_1_ = (bool)(bVar2 & 1);
            }
          }
          else {
            bVar1 = is<unsigned_short>(v);
            if (bVar1) {
              puVar9 = get<unsigned_short>(v);
              val_2._0_2_ = *puVar9;
              be_3._2_2_ = __bswap_16((__uint16_t)val_2);
              std::ostream::put(cVar24);
              bVar2 = std::ios::good();
              tmp._7_1_ = (bool)(bVar2 & 1);
              if (tmp._7_1_ != false) {
                std::ostream::write((char *)output,(long)&be_3 + 2);
                bVar2 = std::ios::good();
                tmp._7_1_ = (bool)(bVar2 & 1);
              }
            }
            else {
              bVar1 = is<unsigned_int>(v);
              if (bVar1) {
                puVar10 = get<unsigned_long>(v);
                be_4._4_4_ = (__uint32_t)*puVar10;
                be_4._0_4_ = __bswap_32(be_4._4_4_);
                std::ostream::put(cVar24);
                bVar2 = std::ios::good();
                tmp._7_1_ = (bool)(bVar2 & 1);
                if (tmp._7_1_ != false) {
                  std::ostream::write((char *)output,(long)&be_4);
                  bVar2 = std::ios::good();
                  tmp._7_1_ = (bool)(bVar2 & 1);
                }
              }
              else {
                bVar1 = is<unsigned_long>(v);
                if (bVar1) {
                  puVar10 = get<unsigned_long>(v);
                  _Stack_b8 = __bswap_64(*puVar10);
                  std::ostream::put(cVar24);
                  bVar2 = std::ios::good();
                  tmp._7_1_ = (bool)(bVar2 & 1);
                  if (tmp._7_1_ != false) {
                    std::ostream::write((char *)output,(long)&stack0xffffffffffffff48);
                    bVar2 = std::ios::good();
                    tmp._7_1_ = (bool)(bVar2 & 1);
                  }
                }
                else {
                  bVar1 = is<signed_char>(v);
                  if (bVar1) {
                    pcVar11 = get<signed_char>(v);
                    val_5._3_1_ = *pcVar11;
                    std::ostream::put(cVar24);
                    bVar2 = std::ios::good();
                    tmp._7_1_ = (bool)(bVar2 & 1);
                    if (tmp._7_1_ != false) {
                      std::ostream::write((char *)output,(long)&val_5 + 3);
                      bVar2 = std::ios::good();
                      tmp._7_1_ = (bool)(bVar2 & 1);
                    }
                  }
                  else {
                    bVar1 = is<short>(v);
                    if (bVar1) {
                      p_Var12 = (__uint16_t *)get<short>(v);
                      val_5._0_2_ = *p_Var12;
                      be_6._2_2_ = __bswap_16((__uint16_t)val_5);
                      std::ostream::put(cVar24);
                      bVar2 = std::ios::good();
                      tmp._7_1_ = (bool)(bVar2 & 1);
                      if (tmp._7_1_ != false) {
                        std::ostream::write((char *)output,(long)&be_6 + 2);
                        bVar2 = std::ios::good();
                        tmp._7_1_ = (bool)(bVar2 & 1);
                      }
                    }
                    else {
                      bVar1 = is<int>(v);
                      if (bVar1) {
                        p_Var13 = (__uint32_t *)get<int>(v);
                        be_7._4_4_ = *p_Var13;
                        be_7._0_4_ = __bswap_32(be_7._4_4_);
                        std::ostream::put(cVar24);
                        bVar2 = std::ios::good();
                        tmp._7_1_ = (bool)(bVar2 & 1);
                        if (tmp._7_1_ != false) {
                          std::ostream::write((char *)output,(long)&be_7);
                          bVar2 = std::ios::good();
                          tmp._7_1_ = (bool)(bVar2 & 1);
                        }
                      }
                      else {
                        bVar1 = is<long>(v);
                        if (bVar1) {
                          p_Var14 = (__uint64_t *)get<long>(v);
                          _sz_be_3 = __bswap_64(*p_Var14);
                          std::ostream::put(cVar24);
                          bVar2 = std::ios::good();
                          tmp._7_1_ = (bool)(bVar2 & 1);
                          if (tmp._7_1_ != false) {
                            std::ostream::write((char *)output,(long)&sz_be_3);
                            bVar2 = std::ios::good();
                            tmp._7_1_ = (bool)(bVar2 & 1);
                          }
                        }
                        else {
                          bVar1 = is<std::__cxx11::string>(v);
                          if (bVar1) {
                            get<std::__cxx11::string>(v);
                            uVar22 = std::__cxx11::string::size();
                            if (uVar22 < 0x100) {
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                get<std::__cxx11::string>(v);
                                std::__cxx11::string::size();
                                plVar21 = (long *)std::ostream::put(cVar24);
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  get<std::__cxx11::string>(v);
                                  lVar15 = std::__cxx11::string::data();
                                  get<std::__cxx11::string>(v);
                                  std::__cxx11::string::size();
                                  plVar21 = (long *)std::ostream::write((char *)output,lVar15);
                                  uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                      *(long *)(*plVar21 + -0x18)));
                                  if ((uVar22 & 1) == 0) {
                                    return true;
                                  }
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::__cxx11::string>(v);
                          if (bVar1) {
                            get<std::__cxx11::string>(v);
                            uVar22 = std::__cxx11::string::size();
                            if (uVar22 < 0x10000) {
                              get<std::__cxx11::string>(v);
                              __bsx = std::__cxx11::string::size();
                              sz_be_4 = __bswap_16(__bsx);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&sz_be_4)
                                ;
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  get<std::__cxx11::string>(v);
                                  lVar15 = std::__cxx11::string::data();
                                  get<std::__cxx11::string>(v);
                                  std::__cxx11::string::size();
                                  plVar21 = (long *)std::ostream::write((char *)output,lVar15);
                                  uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                      *(long *)(*plVar21 + -0x18)));
                                  if ((uVar22 & 1) == 0) {
                                    return true;
                                  }
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::__cxx11::string>(v);
                          if (bVar1) {
                            get<std::__cxx11::string>(v);
                            uVar22 = std::__cxx11::string::size();
                            if (uVar22 < 0x100000000) {
                              get<std::__cxx11::string>(v);
                              __bsx_00 = std::__cxx11::string::size();
                              local_d8 = __bswap_32(__bsx_00);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&local_d8
                                                                     );
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  get<std::__cxx11::string>(v);
                                  lVar15 = std::__cxx11::string::data();
                                  get<std::__cxx11::string>(v);
                                  std::__cxx11::string::size();
                                  plVar21 = (long *)std::ostream::write((char *)output,lVar15);
                                  uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                      *(long *)(*plVar21 + -0x18)));
                                  if ((uVar22 & 1) == 0) {
                                    return true;
                                  }
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
                          if (bVar1) {
                            pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size(pvVar16)
                            ;
                            if (sVar17 < 0x10000) {
                              pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size
                                                 (pvVar16);
                              i._6_2_ = __bswap_16((__uint16_t)sVar17);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&i + 6);
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  uStack_e8 = 0;
                                  while( true ) {
                                    uVar22 = uStack_e8;
                                    pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v)
                                    ;
                                    sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size
                                                       (pvVar16);
                                    local_209 = false;
                                    if (uVar22 < sVar17) {
                                      local_209 = tmp._7_1_;
                                    }
                                    if (local_209 == false) break;
                                    pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v)
                                    ;
                                    pvVar18 = std::vector<std::any,_std::allocator<std::any>_>::
                                              operator[](pvVar16,uStack_e8);
                                    tmp._7_1_ = serialize(pvVar18,output);
                                    uStack_e8 = uStack_e8 + 1;
                                  }
                                  return tmp._7_1_;
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
                          if (bVar1) {
                            pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size(pvVar16)
                            ;
                            if (sVar17 < 0x100000000) {
                              pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size
                                                 (pvVar16);
                              i_1._4_4_ = __bswap_32((__uint32_t)sVar17);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&i_1 + 4)
                                ;
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  uStack_f8 = 0;
                                  while( true ) {
                                    uVar22 = uStack_f8;
                                    pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v)
                                    ;
                                    sVar17 = std::vector<std::any,_std::allocator<std::any>_>::size
                                                       (pvVar16);
                                    local_219 = false;
                                    if (uVar22 < sVar17) {
                                      local_219 = tmp._7_1_;
                                    }
                                    if (local_219 == false) break;
                                    pvVar16 = get<std::vector<std::any,std::allocator<std::any>>>(v)
                                    ;
                                    pvVar18 = std::vector<std::any,_std::allocator<std::any>_>::
                                              operator[](pvVar16,uStack_f8);
                                    tmp._7_1_ = serialize(pvVar18,output);
                                    uStack_f8 = uStack_f8 + 1;
                                  }
                                  return tmp._7_1_;
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                            (v);
                          if (bVar1) {
                            pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                (v);
                            sVar20 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                     ::size(pmVar19);
                            if (sVar20 < 0x10000) {
                              pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                  (v);
                              sVar20 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                       ::size(pmVar19);
                              o._6_2_ = __bswap_16((__uint16_t)sVar20);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&o + 6);
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  it_2._M_node = (_Base_ptr)
                                                 get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                           (v);
                                  local_110._M_node =
                                       (_Base_ptr)
                                       std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                                *)it_2._M_node);
                                  do {
                                    key_1._M_storage =
                                         (_Storage)
                                         std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                                *)it_2._M_node);
                                    bVar1 = std::operator!=(&local_110,(_Self *)&key_1._M_storage);
                                    local_229 = false;
                                    if (bVar1) {
                                      local_229 = tmp._7_1_;
                                    }
                                    if (local_229 == false) {
                                      return tmp._7_1_;
                                    }
                                    ppVar23 = std::
                                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                              ::operator->(&local_110);
                                    std::any::
                                    any<std::__cxx11::string_const&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                                              ((any *)local_128,&ppVar23->first);
                                    bVar1 = serialize((any *)local_128,output);
                                    if (bVar1) {
                                      ppVar23 = std::
                                                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                                ::operator->(&local_110);
                                      bVar1 = serialize(&ppVar23->second,output);
                                      if (!bVar1) goto LAB_00194568;
                                    }
                                    else {
LAB_00194568:
                                      tmp._7_1_ = false;
                                    }
                                    std::any::~any((any *)local_128);
                                    std::
                                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                    ::operator++(&local_110);
                                  } while( true );
                                }
                              }
                              return false;
                            }
                          }
                          bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                            (v);
                          if (bVar1) {
                            pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                (v);
                            sVar20 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                     ::size(pmVar19);
                            if (sVar20 < 0x100000000) {
                              pmVar19 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                  (v);
                              sVar20 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                       ::size(pmVar19);
                              o_1._4_4_ = __bswap_32((__uint32_t)sVar20);
                              plVar21 = (long *)std::ostream::put(cVar24);
                              uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                  *(long *)(*plVar21 + -0x18)));
                              if ((uVar22 & 1) == 0) {
                                plVar21 = (long *)std::ostream::write((char *)output,(long)&o_1 + 4)
                                ;
                                uVar22 = std::ios::operator!((ios *)((long)plVar21 +
                                                                    *(long *)(*plVar21 + -0x18)));
                                if ((uVar22 & 1) == 0) {
                                  it_3._M_node = (_Base_ptr)
                                                 get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                           (v);
                                  local_140._M_node =
                                       (_Base_ptr)
                                       std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                                *)it_3._M_node);
                                  do {
                                    key_2._M_storage =
                                         (_Storage)
                                         std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                                *)it_3._M_node);
                                    bVar1 = std::operator!=(&local_140,(_Self *)&key_2._M_storage);
                                    local_23a = false;
                                    if (bVar1) {
                                      local_23a = tmp._7_1_;
                                    }
                                    if (local_23a == false) {
                                      return tmp._7_1_;
                                    }
                                    ppVar23 = std::
                                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                              ::operator->(&local_140);
                                    std::any::
                                    any<std::__cxx11::string_const&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                                              ((any *)local_158,&ppVar23->first);
                                    bVar1 = serialize((any *)local_158,output);
                                    if (bVar1) {
                                      ppVar23 = std::
                                                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                                ::operator->(&local_140);
                                      bVar1 = serialize(&ppVar23->second,output);
                                      if (!bVar1) goto LAB_00194747;
                                    }
                                    else {
LAB_00194747:
                                      tmp._7_1_ = false;
                                    }
                                    std::any::~any((any *)local_158);
                                    std::
                                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                                    ::operator++(&local_140);
                                  } while( true );
                                }
                              }
                              return false;
                            }
                          }
                          tmp._7_1_ = false;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tmp._7_1_;
}

Assistant:

bool msgpack::serialize(const any& v, std::ostream& output)
  {
    bool ret = true;

    if (is<object_t>(v) && get<object_t>(v).size() <= 15) // fixmap	1000xxxx
    {
      ret = output.put(static_cast<char>(0x80 | (0x0F & get<object_t>(v).size()))).good();
      if (ret)
      {
        const goodform::object_t& tmp = get<object_t>(v);
        for (auto it = tmp.begin(); it != tmp.end(); ++it)
        {
          any key = it->first;
          ret = msgpack::serialize(key, output);
          if (ret)
            ret = msgpack::serialize(it->second, output);
        }
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 15) // fixarray	1001xxxx
    {
      ret = output.put(static_cast<char>(0x90 | (0x0F & get<array_t>(v).size()))).good();
      if (ret)
      {
        const goodform::array_t& tmp = get<array_t>(v);
        for (auto it = tmp.begin(); it != tmp.end(); ++it)
        {
          ret = msgpack::serialize(*it, output);
        }
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 31) // fixstr	101xxxxx
    {
      ret = output.put(static_cast<char>(0xA0 | (0x1F & get<std::string>(v).size()))).good();
      if (ret)
      {
        ret = output.write(&(get<std::string>(v)[0]), get<std::string>(v).size()).good();
      }
    }
    else if (is<std::nullptr_t>(v))
    {
      output.put(static_cast<char>(0xC0));
    }
    else if (is<bool>(v))
    {
      if (get<bool>(v))
        output.put(static_cast<char>(0xC3));
      else
        output.put(static_cast<char>(0xC2));
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFF) // Bin 8
    {
      if (!output.put(static_cast<char>(0xC4))
        || !output.put(static_cast<char>(0xFF & get<binary_t>(v).size()))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFFFF) // Bin 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<binary_t>(v).size()));
      if (!output.put(static_cast<char>(0xC5))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFFFFFFFF) // Bin 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<binary_t>(v).size()));
      if (!output.put(static_cast<char>(0xC6))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<float>(v))
    {
      float flt = get<float>(v);

      numeric_union32 nu;
      nu.f = static_cast<float>(flt);
      std::uint32_t be(htobe32(nu.i));
      ret = output.put(static_cast<char>(0xCA)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<double>(v))
    {
      double dbl = get<double>(v);
      numeric_union64 nu;
      nu.f = dbl;
      std::uint64_t be(htobe64(nu.i));
      ret = output.put(static_cast<char>(0xCB)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
      // IGNORING fixint types for now.
//    else if (v.type() == variant_type::unsigned_integer && v.get<std::uint64_t>() <= 0x7F) // positive fixint 0xxxxxxx
//    {
//      std::uint8_t val = static_cast<std::uint8_t>(v.get<std::uint64_t>());
//      ret = output.put(static_cast<char>(std::uint8_t(0x7F) & val)).good();
//    }
//    else if (v.type() == variant_type::signed_integer && v.get<std::int64_t>() < 0 && v.get<std::int64_t>() >= -31) // negative fixint	111xxxxx
//    {
//      std::int8_t val = static_cast<std::int8_t>(v.get<std::int64_t>());
//      ret = output.put(static_cast<char>(0xE0 | (0x1F & (val * -1)))).good();
//    }
    else if (is<std::uint8_t>(v)) // Uint 8
    {
      std::uint8_t val = get<std::uint8_t>(v);
      ret = output.put(static_cast<char>(0xCC)).good();
      if (ret)
        ret = output.write((char*)&val, sizeof(std::uint8_t)).good();
    }
    else if (is<std::uint16_t>(v)) // Uint 16
    {
      std::uint16_t val = get<std::uint16_t>(v);
      std::uint16_t be(htobe16(val));
      ret = output.put(static_cast<char>(0xCD)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::uint32_t>(v)) // Uint 32
    {
      std::uint32_t val = get<std::uint64_t>(v);
      std::uint32_t be(htobe32(val));
      ret = output.put(static_cast<char>(0xCE)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::uint64_t>(v)) // Uint 64
    {
      std::uint64_t be(htobe64(get<std::uint64_t>(v)));
      ret = output.put(static_cast<char>(0xCF)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int8_t>(v)) // Int 8
    {
      std::int8_t val = get<std::int8_t>(v);
      ret = output.put(static_cast<char>(0xD0)).good();
      if (ret)
        ret = output.write((char*)&val, sizeof(std::int8_t)).good();
    }
    else if (is<std::int16_t>(v)) // Int 16
    {
      std::int16_t val = get<std::int16_t>(v);
      std::int16_t be(htobe16(val));
      ret = output.put(static_cast<char>(0xD1)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int32_t>(v)) // Int 32
    {
      std::int32_t val = get<std::int32_t>(v);
      std::int32_t be(htobe32(val));
      ret = output.put(static_cast<char>(0xD2)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int64_t>(v)) // Int 64
    {
      std::int64_t be(htobe64(get<std::int64_t>(v)));
      ret = output.put(static_cast<char>(0xD3)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFF) // str 8
    {
      if (!output.put(static_cast<char>(0xD9))
        || !output.put(static_cast<char>(0xFF & get<std::string>(v).size()))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFFFF) // str 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<std::string>(v).size()));
      if (!output.put(static_cast<char>(0xDA))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFFFFFFFF) // str 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<std::string>(v).size()));
      if (!output.put(static_cast<char>(0xDB))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 0xFFFF) // array 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<array_t>(v).size()));
      if (!output.put(static_cast<char>(0xDC))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        for (size_t i = 0; i < get<array_t>(v).size() && ret; ++i)
          ret = msgpack::serialize(get<array_t>(v)[i], output);
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 0xFFFFFFFF) // array 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<array_t>(v).size()));
      if (!output.put(static_cast<char>(0xDD))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        for (size_t i = 0; i < get<array_t>(v).size() && ret; ++i)
          ret = msgpack::serialize(get<array_t>(v)[i], output);
      }
    }
    else if (is<object_t>(v) && get<object_t>(v).size() <= 0xFFFF) // map 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<object_t>(v).size()));
      if (!output.put(static_cast<char>(0xDE))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        const goodform::object_t& o = get<object_t>(v);
        for (auto it = o.begin(); it != o.end() && ret; ++it)
        {
          any key(it->first);
          if (!msgpack::serialize(key, output) || !msgpack::serialize(it->second, output))
          {
            ret = false;
          }
        }
      }
    }
    else if (is<object_t>(v) && get<object_t>(v).size() <= 0xFFFFFFFF) // map 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<object_t>(v).size()));
      if (!output.put(static_cast<char>(0xDF))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        const goodform::object_t& o = get<object_t>(v);
        for (auto it = o.begin(); it != o.end() && ret; ++it)
        {
          any key(it->first);
          if (!msgpack::serialize(key, output) || !msgpack::serialize(it->second, output))
          {
            ret = false;
          }
        }
      }
    }
    else
    {
      ret = false;
    }

    return ret;
  }